

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O2

void ncnn::pack_A_tile(Mat *A,Mat *AT,int batch,int max_ii,int max_kk)

{
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  undefined4 *puVar13;
  long lVar14;
  void *pvVar15;
  ulong uVar16;
  void *pvVar17;
  long lVar18;
  undefined4 *puVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  undefined4 *puVar27;
  long lVar28;
  long lVar29;
  void *local_a8;
  long local_88;
  long local_80;
  
  iVar4 = max_kk * batch;
  pvVar2 = AT->data;
  iVar1 = AT->w;
  sVar3 = AT->elemsize;
  lVar22 = (long)iVar4;
  if (max_kk < 1) {
    max_kk = 0;
  }
  local_88 = 0;
  uVar10 = (ulong)(uint)batch;
  if (batch < 1) {
    uVar10 = 0;
  }
  lVar7 = (long)max_ii;
  lVar8 = lVar22 * 0x20;
  lVar14 = (ulong)(uint)batch * 4;
  local_80 = (long)(iVar4 * 7) << 2;
  lVar20 = (long)(iVar4 * 6) << 2;
  lVar24 = (long)(iVar4 * 5) << 2;
  lVar18 = (long)(iVar4 * 4) << 2;
  lVar29 = (long)(iVar4 * 3) << 2;
  lVar28 = (long)(iVar4 * 2) << 2;
  lVar5 = lVar22 * 0x10;
  lVar9 = lVar22 * 4;
  for (uVar6 = 0; uVar6 != uVar10; uVar6 = uVar6 + 1) {
    puVar19 = (undefined4 *)((long)iVar1 * sVar3 * uVar6 + (long)pvVar2);
    local_a8 = A->data;
    lVar11 = lVar9;
    lVar21 = lVar28;
    lVar23 = lVar29;
    lVar25 = local_88;
    for (uVar16 = 0; pvVar15 = local_a8, iVar4 = max_kk, (long)(uVar16 | 7) < lVar7;
        uVar16 = uVar16 + 8) {
      while (iVar4 != 0) {
        *puVar19 = *(undefined4 *)((long)pvVar15 + local_88);
        puVar19[1] = *(undefined4 *)((long)pvVar15 + lVar9);
        puVar19[2] = *(undefined4 *)((long)pvVar15 + lVar28);
        puVar19[3] = *(undefined4 *)((long)pvVar15 + lVar29);
        puVar19[4] = *(undefined4 *)((long)pvVar15 + lVar18);
        puVar19[5] = *(undefined4 *)((long)pvVar15 + lVar24);
        puVar19[6] = *(undefined4 *)((long)pvVar15 + lVar20);
        puVar19[7] = *(undefined4 *)((long)pvVar15 + local_80);
        puVar19 = puVar19 + 8;
        pvVar15 = (void *)((long)pvVar15 + lVar14);
        iVar4 = iVar4 + -1;
      }
      local_a8 = (void *)((long)local_a8 + lVar8);
      lVar25 = lVar25 + lVar8;
      lVar23 = lVar23 + lVar8;
      lVar21 = lVar21 + lVar8;
      lVar11 = lVar11 + lVar8;
    }
    pvVar15 = A->data;
    local_a8 = (void *)0x0;
    lVar12 = lVar11;
    lVar26 = lVar25;
    for (; pvVar17 = local_a8, iVar4 = max_kk, (long)(uVar16 | 3) < lVar7; uVar16 = uVar16 + 4) {
      while (iVar4 != 0) {
        *puVar19 = *(undefined4 *)((long)pvVar15 + (long)pvVar17 + lVar25);
        puVar19[1] = *(undefined4 *)((long)pvVar15 + (long)pvVar17 + lVar11);
        puVar19[2] = *(undefined4 *)((long)pvVar15 + (long)pvVar17 + lVar21);
        puVar19[3] = *(undefined4 *)((long)pvVar15 + (long)pvVar17 + lVar23);
        puVar19 = puVar19 + 4;
        pvVar17 = (void *)((long)pvVar17 + lVar14);
        iVar4 = iVar4 + -1;
      }
      local_a8 = (void *)((long)local_a8 + lVar5);
      lVar26 = lVar26 + lVar5;
      lVar12 = lVar12 + lVar5;
    }
    pvVar15 = A->data;
    for (; pvVar17 = pvVar15, iVar4 = max_kk, (long)(uVar16 | 1) < lVar7; uVar16 = uVar16 + 2) {
      while (iVar4 != 0) {
        *puVar19 = *(undefined4 *)((long)pvVar17 + lVar26);
        puVar19[1] = *(undefined4 *)((long)pvVar17 + lVar12);
        puVar19 = puVar19 + 2;
        pvVar17 = (void *)((long)pvVar17 + lVar14);
        iVar4 = iVar4 + -1;
      }
      lVar26 = lVar26 + lVar22 * 8;
      lVar12 = lVar12 + lVar22 * 8;
    }
    puVar27 = (undefined4 *)(lVar26 + (long)A->data);
    for (; puVar13 = puVar27, iVar4 = max_kk, (long)uVar16 < lVar7; uVar16 = uVar16 + 1) {
      while (iVar4 != 0) {
        *puVar19 = *puVar13;
        puVar19 = puVar19 + 1;
        puVar13 = puVar13 + (uint)batch;
        iVar4 = iVar4 + -1;
      }
      puVar27 = puVar27 + lVar22;
    }
    local_88 = local_88 + 4;
    local_80 = local_80 + 4;
    lVar20 = lVar20 + 4;
    lVar24 = lVar24 + 4;
    lVar18 = lVar18 + 4;
    lVar29 = lVar29 + 4;
    lVar28 = lVar28 + 4;
    lVar9 = lVar9 + 4;
  }
  return;
}

Assistant:

static void pack_A_tile(const Mat& A, Mat& AT, int batch, int max_ii, int max_kk)
{
    const int N = max_kk * batch;

    for (int b = 0; b < batch; b++)
    {
        float* pp = AT.row(b);

        int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; ii + 15 < max_ii; ii += 16)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[2 * N];
                pp[3] = p0[3 * N];
                pp[4] = p0[4 * N];
                pp[5] = p0[5 * N];
                pp[6] = p0[6 * N];
                pp[7] = p0[7 * N];
                pp[8] = p0[8 * N];
                pp[9] = p0[9 * N];
                pp[10] = p0[10 * N];
                pp[11] = p0[11 * N];
                pp[12] = p0[12 * N];
                pp[13] = p0[13 * N];
                pp[14] = p0[14 * N];
                pp[15] = p0[15 * N];
                p0 += batch;
                pp += 16;
            }
        }
#endif // __AVX512F__
        for (; ii + 7 < max_ii; ii += 8)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[2 * N];
                pp[3] = p0[3 * N];
                pp[4] = p0[4 * N];
                pp[5] = p0[5 * N];
                pp[6] = p0[6 * N];
                pp[7] = p0[7 * N];
                p0 += batch;
                pp += 8;
            }
        }
#endif // __AVX__
        for (; ii + 3 < max_ii; ii += 4)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[2 * N];
                pp[3] = p0[3 * N];
                p0 += batch;
                pp += 4;
            }
        }
#endif // __SSE2__
        for (; ii + 1 < max_ii; ii += 2)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                p0 += batch;
                pp += 2;
            }
        }
        for (; ii < max_ii; ii++)
        {
            const float* p0 = (const float*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                p0 += batch;
                pp += 1;
            }
        }
    }
}